

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib582.c
# Opt level: O0

void notifyCurl(CURLM *curl,curl_socket_t s,int evBitmask,char *info)

{
  FILE *__stream;
  char *pcVar1;
  uint uVar2;
  undefined8 uVar3;
  undefined4 local_24;
  CURLMcode result;
  int numhandles;
  char *info_local;
  int evBitmask_local;
  curl_socket_t s_local;
  CURLM *curl_local;
  
  local_24 = 0;
  _result = info;
  info_local._0_4_ = evBitmask;
  info_local._4_4_ = s;
  _evBitmask_local = curl;
  uVar2 = curl_multi_socket_action(curl,s,evBitmask,&local_24);
  pcVar1 = _result;
  __stream = _stderr;
  if (uVar2 != 0) {
    uVar3 = curl_multi_strerror(uVar2);
    fprintf(__stream,"Curl error on %s: %i (%s)\n",pcVar1,(ulong)uVar2,uVar3);
  }
  return;
}

Assistant:

static void notifyCurl(CURLM *curl, curl_socket_t s, int evBitmask,
                       const char *info)
{
  int numhandles = 0;
  CURLMcode result = curl_multi_socket_action(curl, s, evBitmask, &numhandles);
  if (result != CURLM_OK) {
    fprintf(stderr, "Curl error on %s: %i (%s)\n",
            info, result, curl_multi_strerror(result));
  }
}